

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

module __thiscall pybind11::module::def_submodule(module *this,char *name,char *doc)

{
  char **ppcVar1;
  long *plVar2;
  char *pcVar3;
  undefined8 *puVar4;
  PyObject *pPVar5;
  char *in_RCX;
  ulong uVar6;
  string full_name;
  allocator local_d2;
  allocator local_d1;
  char **local_d0;
  PyObject *local_c8;
  char *local_c0;
  object oStack_b8;
  handle local_b0;
  long local_a8;
  PyObject local_a0;
  long *local_90;
  undefined8 local_88;
  long local_80;
  undefined8 uStack_78;
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  char **local_50;
  long local_48;
  char *local_40 [2];
  
  pcVar3 = (char *)PyModule_GetName(*(undefined8 *)name);
  std::__cxx11::string::string((string *)&local_b0,pcVar3,&local_d1);
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,".","");
  uVar6 = 0xf;
  if (local_b0.m_ptr != &local_a0) {
    uVar6 = local_a0.ob_refcnt;
  }
  if (uVar6 < (ulong)(local_68 + local_a8)) {
    uVar6 = 0xf;
    if (local_70 != local_60) {
      uVar6 = local_60[0];
    }
    if (uVar6 < (ulong)(local_68 + local_a8)) goto LAB_0012ec11;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_b0.m_ptr);
  }
  else {
LAB_0012ec11:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_70);
  }
  local_d0 = &local_c0;
  ppcVar1 = (char **)(puVar4 + 2);
  if ((char **)*puVar4 == ppcVar1) {
    local_c0 = *ppcVar1;
    oStack_b8.super_handle.m_ptr = (handle)puVar4[3];
  }
  else {
    local_c0 = *ppcVar1;
    local_d0 = (char **)*puVar4;
  }
  local_c8 = (PyObject *)puVar4[1];
  *puVar4 = ppcVar1;
  puVar4[1] = 0;
  *(undefined1 *)ppcVar1 = 0;
  std::__cxx11::string::string((string *)&local_50,doc,&local_d2);
  pcVar3 = (char *)0xf;
  if (local_d0 != &local_c0) {
    pcVar3 = local_c0;
  }
  if (pcVar3 < (char *)(local_48 + (long)local_c8)) {
    pcVar3 = (char *)0xf;
    if (local_50 != local_40) {
      pcVar3 = local_40[0];
    }
    if ((char *)(local_48 + (long)local_c8) <= pcVar3) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_d0);
      goto LAB_0012ed01;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_50);
LAB_0012ed01:
  local_90 = &local_80;
  plVar2 = puVar4 + 2;
  if ((long *)*puVar4 == plVar2) {
    local_80 = *plVar2;
    uStack_78 = puVar4[3];
  }
  else {
    local_80 = *plVar2;
    local_90 = (long *)*puVar4;
  }
  local_88 = puVar4[1];
  *puVar4 = plVar2;
  puVar4[1] = 0;
  *(undefined1 *)plVar2 = 0;
  if (local_50 != local_40) {
    operator_delete(local_50,(ulong)(local_40[0] + 1));
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,(ulong)(local_c0 + 1));
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  if (local_b0.m_ptr != &local_a0) {
    operator_delete(local_b0.m_ptr,local_a0.ob_refcnt + 1);
  }
  pPVar5 = (PyObject *)PyImport_AddModule(local_90);
  (this->super_object).super_handle.m_ptr = pPVar5;
  if (pPVar5 != (PyObject *)0x0) {
    pPVar5->ob_refcnt = pPVar5->ob_refcnt + 1;
  }
  if ((in_RCX != (char *)0x0) && (options::global_state()::instance == '\x01')) {
    str::str((str *)&local_b0,in_RCX);
    local_c8 = (this->super_object).super_handle.m_ptr;
    local_c0 = "__doc__";
    oStack_b8.super_handle.m_ptr = (handle)(PyObject *)0x0;
    detail::accessor_policies::str_attr::set((handle)local_c8,"__doc__",local_b0);
    object::~object(&oStack_b8);
    object::~object((object *)&local_b0);
  }
  local_c8 = *(PyObject **)name;
  oStack_b8.super_handle.m_ptr = (handle)(PyObject *)0x0;
  local_c0 = doc;
  detail::accessor_policies::str_attr::set
            ((handle)local_c8,doc,(this->super_object).super_handle.m_ptr);
  object::~object(&oStack_b8);
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  return (object)(object)this;
}

Assistant:

module def_submodule(const char *name, const char *doc = nullptr) {
        std::string full_name = std::string(PyModule_GetName(m_ptr))
            + std::string(".") + std::string(name);
        auto result = reinterpret_borrow<module>(PyImport_AddModule(full_name.c_str()));
        if (doc && options::show_user_defined_docstrings())
            result.attr("__doc__") = pybind11::str(doc);
        attr(name) = result;
        return result;
    }